

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive.cpp
# Opt level: O0

uint32_t __thiscall ArchiveMemberHeader::getSize(ArchiveMemberHeader *this)

{
  uint uVar1;
  uint32_t uVar2;
  char *__end;
  longlong lVar3;
  Fatal local_1e0;
  longlong local_58;
  longlong sizeInt;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string sizeString;
  char *end;
  ArchiveMemberHeader *this_local;
  
  __end = (char *)memchr(this->size,0x20,10);
  sizeString.field_2._8_8_ = __end;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<char_const*,void>
            ((string *)local_38,(char *)this->size,__end,&local_39);
  std::allocator<char>::~allocator(&local_39);
  lVar3 = std::__cxx11::stoll((string *)local_38,(size_t *)0x0,10);
  local_58 = lVar3;
  if (-1 < lVar3) {
    uVar1 = std::numeric_limits<unsigned_int>::max();
    if (lVar3 < (long)(ulong)uVar1) {
      uVar2 = (uint32_t)local_58;
      std::__cxx11::string::~string((string *)local_38);
      return uVar2;
    }
  }
  ::wasm::Fatal::Fatal(&local_1e0);
  ::wasm::Fatal::operator<<(&local_1e0,(char (*) [40])"Malformed archive: size parsing failed\n");
  ::wasm::Fatal::~Fatal(&local_1e0);
}

Assistant:

uint32_t ArchiveMemberHeader::getSize() const {
  auto* end = static_cast<const char*>(memchr(size, ' ', sizeof(size)));
  std::string sizeString((const char*)size, end);
  auto sizeInt = std::stoll(sizeString, nullptr, 10);
  if (sizeInt < 0 || sizeInt >= std::numeric_limits<uint32_t>::max()) {
    wasm::Fatal() << "Malformed archive: size parsing failed\n";
  }
  return static_cast<uint32_t>(sizeInt);
}